

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QRegularExpression::setPatternOptions(QRegularExpression *this,PatternOptions options)

{
  QRegularExpressionPrivate *pQVar1;
  
  if ((QFlagsStorageHelper<QRegularExpression::PatternOption,_4>)
      (((this->d).d.ptr)->patternOptions).
      super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
      super_QFlagsStorage<QRegularExpression::PatternOption>.i !=
      (QFlagsStorage<QRegularExpression::PatternOption>)
      options.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
      super_QFlagsStorage<QRegularExpression::PatternOption>.i) {
    QExplicitlySharedDataPointer<QRegularExpressionPrivate>::detach(&this->d);
    pQVar1 = (this->d).d.ptr;
    pQVar1->isDirty = true;
    (pQVar1->patternOptions).super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
    super_QFlagsStorage<QRegularExpression::PatternOption>.i =
         (Int)options.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
              super_QFlagsStorage<QRegularExpression::PatternOption>.i;
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }